

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall xLearn::Solver::Clear(Solver *this)

{
  ostream *poVar1;
  size_type sVar2;
  reference ppRVar3;
  long in_RDI;
  size_t i;
  Model *in_stack_ffffffffffffff20;
  Logger *in_stack_ffffffffffffff30;
  void *pvVar4;
  ulong local_a0;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  string *in_stack_ffffffffffffffa8;
  LogSeverity in_stack_ffffffffffffffb4;
  allocator local_31;
  string local_30 [36];
  Logger local_c [3];
  
  Logger::Logger(local_c,INFO);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/solver.cc"
             ,&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff98,"Clear",&local_69);
  poVar1 = Logger::Start(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
                         in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98);
  std::operator<<(poVar1,"Clear the xLearn environment ...");
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  Logger::~Logger(in_stack_ffffffffffffff30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"Clear the xLearn environment ...",&local_91);
  Color::print_action(&in_stack_ffffffffffffff20->score_func_);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  pvVar4 = *(void **)(in_RDI + 0x248);
  if (pvVar4 != (void *)0x0) {
    Model::~Model(in_stack_ffffffffffffff20);
    operator_delete(pvVar4);
  }
  for (local_a0 = 0;
      sVar2 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::size
                        ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
                         (in_RDI + 0x250)), local_a0 < sVar2; local_a0 = local_a0 + 1) {
    ppRVar3 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                        ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
                         (in_RDI + 0x250),local_a0);
    if (*ppRVar3 != (value_type)0x0) {
      ppRVar3 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                          ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
                           (in_RDI + 0x250),local_a0);
      if (*ppRVar3 != (value_type)0x0) {
        (*(*ppRVar3)->_vptr_Reader[1])();
      }
    }
  }
  std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::clear
            ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)0x22fed7);
  return;
}

Assistant:

void Solver::Clear() {
  LOG(INFO) << "Clear the xLearn environment ...";
  Color::print_action("Clear the xLearn environment ...");
  // Clear model
  delete this->model_;
  // Clear Reader
  for (size_t i = 0; i < this->reader_.size(); ++i) {
    if (reader_[i] != nullptr) {
      delete reader_[i];
    }
  }
  reader_.clear();
}